

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O3

void sensors_analytics::Sdk::Login(string *login_id)

{
  ulong __n;
  Sdk *this;
  int iVar1;
  ostream *poVar2;
  PropertiesNode properties_node;
  string local_98;
  string local_78;
  ObjectNode local_58;
  
  this = instance_;
  if (instance_ == (Sdk *)0x0) {
    return;
  }
  __n = login_id->_M_string_length;
  if (0xff < __n) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"loginId:",8);
    poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cout,(login_id->_M_dataplus)._M_p,
                        login_id->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar2,"is beyond the maximum length 255",0x20);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
    std::ostream::put((char)poVar2);
    std::ostream::flush();
    return;
  }
  if ((instance_->distinct_id_)._M_string_length == __n) {
    if (__n == 0) {
      return;
    }
    iVar1 = bcmp((instance_->distinct_id_)._M_dataplus._M_p,(login_id->_M_dataplus)._M_p,__n);
    if (iVar1 == 0) {
      return;
    }
  }
  local_58.properties_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_58.properties_map_._M_t._M_impl.super__Rb_tree_header._M_header;
  local_58.properties_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_58.properties_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_58.properties_map_._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_58._vptr_ObjectNode = (_func_int **)&PTR_SetList_00122d40;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_58.properties_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       local_58.properties_map_._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,"track_signup","");
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_98,"$SignUp","");
  AddEvent(this,&local_78,&local_98,&local_58,login_id,&instance_->distinct_id_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  std::__cxx11::string::_M_assign((string *)&instance_->distinct_id_);
  instance_->is_login_id_ = true;
  Notify();
  local_58._vptr_ObjectNode = (_func_int **)&PTR_SetList_00122d10;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sensors_analytics::utils::ObjectNode::ValueNode>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sensors_analytics::utils::ObjectNode::ValueNode>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sensors_analytics::utils::ObjectNode::ValueNode>_>_>
  ::~_Rb_tree(&local_58.properties_map_._M_t);
  return;
}

Assistant:

void Sdk::Login(const string &login_id) {
  if (instance_) {

      if (login_id.length() > 255) {
          cout << "loginId:" << login_id << "is beyond the maximum length 255" << endl;
          return;
      }

      if (instance_->distinct_id_ == login_id) {
          return;
      }

    PropertiesNode properties_node;
    instance_->AddEvent("track_signup",
                        "$SignUp",
                        properties_node,
                        login_id,
                        instance_->distinct_id_);
    instance_->distinct_id_ = login_id;
    instance_->is_login_id_ = true;

      instance_->Notify();
  }
}